

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.c
# Opt level: O2

HT_TimelineListenerContainer * ht_registry_find_listener_container(char *name)

{
  uint32_t uVar1;
  uint32_t uVar2;
  HT_TimelineListenerContainer *pHVar3;
  ulong uVar4;
  
  uVar1 = djb2_hash(name);
  ht_mutex_lock(listeners_register_mutex);
  pHVar3 = (HT_TimelineListenerContainer *)0x0;
  uVar4 = 0;
  do {
    if (listeners_register.size <= uVar4) {
LAB_00108178:
      ht_mutex_unlock(listeners_register_mutex);
      return pHVar3;
    }
    uVar2 = ht_timeline_listener_container_get_id
                      ((HT_TimelineListenerContainer *)listeners_register.data[uVar4]);
    if (uVar2 == uVar1) {
      pHVar3 = (HT_TimelineListenerContainer *)listeners_register.data[uVar4];
      goto LAB_00108178;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

HT_TimelineListenerContainer*
ht_registry_find_listener_container(const char* name)
{
    size_t i;
    uint32_t id = djb2_hash(name);

    ht_mutex_lock(listeners_register_mutex);
    for (i = 0; i < listeners_register.size; i++)
    {
        if (ht_timeline_listener_container_get_id((HT_TimelineListenerContainer*)listeners_register.data[i]) == id)
        {
            HT_TimelineListenerContainer* container = (HT_TimelineListenerContainer*)listeners_register.data[i];
            ht_mutex_unlock(listeners_register_mutex);
            return container;
        }
    }
    ht_mutex_unlock(listeners_register_mutex);

    return NULL;
}